

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlCrc32.cpp
# Opt level: O1

filepos_t __thiscall
libebml::EbmlCrc32::ReadData(EbmlCrc32 *this,IOCallback *input,ScopeMode ReadFully)

{
  int iVar1;
  undefined4 extraout_var;
  uint32 *Buffer;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (ReadFully != SCOPE_NO_DATA) {
    iVar1 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    Buffer = (uint32 *)operator_new__(CONCAT44(extraout_var,iVar1),(nothrow_t *)&std::nothrow);
    iVar1 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    if (Buffer == (uint32 *)0x0) {
      (*input->_vptr_IOCallback[3])(input,CONCAT44(extraout_var_00,iVar1),1);
    }
    else {
      IOCallback::readFully(input,Buffer,CONCAT44(extraout_var_00,iVar1));
      this->m_crc_final = *Buffer;
      operator_delete__(Buffer);
      (this->super_EbmlBinary).super_EbmlElement.bValueIsSet = true;
    }
  }
  iVar1 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_01,iVar1);
}

Assistant:

filepos_t EbmlCrc32::ReadData(IOCallback & input, ScopeMode ReadFully)
{
  if (ReadFully != SCOPE_NO_DATA) {
    binary *Buffer = new (std::nothrow) binary[GetSize()];
    if (Buffer == NULL) {
      // impossible to read, skip it
      input.setFilePointer(GetSize(), seek_current);
    } else {
      input.readFully(Buffer, GetSize());

      memcpy((void *)&m_crc_final, Buffer, 4);
      delete [] Buffer;
      SetValueIsSet();
    }
  }

  return GetSize();
}